

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.h
# Opt level: O3

void * calloc(size_t __nmemb,size_t __size)

{
  void *pvVar1;
  
  if (s_useDLMalloc == '\0') {
    pvVar1 = dlcalloc(__nmemb,__size);
    return pvVar1;
  }
  pvVar1 = cookmem::
           MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
           allocate(&s_memCtx.
                     super_MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                     .m_pool,__size * __nmemb);
  if (pvVar1 != (void *)0x0) {
    pvVar1 = memset(pvVar1,0,__size * __nmemb);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void*
calloc (std::size_t num, std::size_t size)
{
    if (s_useDLMalloc)
    {
        return dlcalloc(num, size);
    }
    else
    {
        return s_memCtx.callocate(num, size);
    }
}